

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintOldCustomModules(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  char *format;
  long lVar6;
  string name;
  string ext;
  string filename;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  cmsys::SystemTools::GetFilenameLastExtension(&local_a0,&local_40);
  cmsys::SystemTools::UpperCase(&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_a0,&local_40);
  iVar2 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar2 == 0) {
LAB_002ef80d:
    std::__ostream_insert<char,std::char_traits<char>>(os,"<html><title>",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</title><body>\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"cmake --help-custom-modules no longer supported\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<p/>\n",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
               ,0x15b);
    lVar6 = 0xf;
    pcVar4 = "</body></html>\n";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar2 == 0) goto LAB_002ef80d;
    if ((local_80._M_string_length == 2) && ((byte)(local_80._M_dataplus._M_p[1] - 0x31U) < 9)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,".TH ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_60._M_dataplus._M_p._0_1_ = local_80._M_dataplus._M_p[1];
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_60,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," \"",2);
      cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_(&local_60,(SystemTools *)"%B %d, %Y",format)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                  (char)local_60._M_dataplus._M_p),
                          local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" \"cmake ",9);
      pcVar4 = cmVersion::GetCMakeVersion();
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n.SH NAME\n.PP\n",0xf);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," \\- ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"cmake --help-custom-modules no longer supported\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n.SH DESCRIPTION\n.PP\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,
                 "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
                 ,0x15b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002ef8f9;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"cmake --help-custom-modules no longer supported\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    lVar6 = 0x15b;
    pcVar4 = 
    "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,lVar6);
LAB_002ef8f9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDocumentation::PrintOldCustomModules(std::ostream& os)
{
  // CheckOptions abuses the Argument field to give us the file name.
  std::string filename = this->CurrentArgument;
  std::string ext = cmSystemTools::UpperCase(
    cmSystemTools::GetFilenameLastExtension(filename));
  std::string name = cmSystemTools::GetFilenameWithoutLastExtension(filename);

  const char* summary = "cmake --help-custom-modules no longer supported\n";
  const char* detail =
    "CMake versions prior to 3.0 exposed their internal module help page\n"
    "generation functionality through the --help-custom-modules option.\n"
    "CMake versions 3.0 and above use other means to generate their module\n"
    "help pages so this functionality is no longer available to be exposed.\n"
    "\n"
    "This file was generated as a placeholder to provide this information.\n"
    ;
  if((ext == ".HTM") || (ext == ".HTML"))
    {
    os << "<html><title>" << name << "</title><body>\n"
       << summary << "<p/>\n" << detail << "</body></html>\n";
    }
  else if((ext.length()==2) && (ext[1] >='1') && (ext[1]<='9'))
    {
    os <<
      ".TH " << name << " " << ext[1] << " \"" <<
      cmSystemTools::GetCurrentDateTime("%B %d, %Y") <<
      "\" \"cmake " << cmVersion::GetCMakeVersion() << "\"\n"
      ".SH NAME\n"
      ".PP\n" <<
      name << " \\- " << summary <<
      "\n"
      ".SH DESCRIPTION\n"
      ".PP\n" <<
      detail
      ;
    }
  else
    {
    os << name << "\n\n" << summary << "\n" << detail;
    }
  return true;
}